

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int usage(char *prog,int level)

{
  int nfields;
  char *mesg;
  long lVar1;
  field_s nim_fields [63];
  
  switch(level) {
  case 1:
    fprintf(_stdout,"usage %s [options] -infiles files...\n",prog);
    fprintf(_stdout,"usage %s -help\n",prog);
    return -1;
  case 2:
    use_full(prog);
    return 1;
  case 3:
    for (lVar1 = 0; lVar1 != 0x74; lVar1 = lVar1 + 4) {
      fputs((char *)((long)&g_history_rel + (long)*(int *)((long)&g_history_rel + lVar1)),_stdout);
    }
    return 1;
  case 4:
    fill_hdr_field_array(nim_fields);
    mesg = "nifti_1_header: ";
    nfields = 0x2b;
    break;
  case 5:
    fill_nim_field_array(nim_fields);
    mesg = "nifti_image: ";
    nfields = 0x3f;
    break;
  case 6:
    fill_ana_field_array(nim_fields);
    mesg = "nifti_analyze75: ";
    nfields = 0x2f;
    break;
  default:
    fprintf(_stdout,"** illegal level for usage(): %d\n");
    return -1;
  case 8:
    fprintf(_stdout,"%s, %s\n",prog,g_version);
    return 1;
  }
  disp_field_s_list(mesg,nim_fields,nfields);
  return 1;
}

Assistant:

int usage(char * prog, int level)
{
   int c, len;
   if( level == USE_SHORT )
   {
      fprintf(stdout,"usage %s [options] -infiles files...\n", prog);
      fprintf(stdout,"usage %s -help\n", prog);
      return -1;
   }
   else if( level == USE_FULL )
      use_full("nifti_tool");  /* let's not allow paths in here */
   else if( level == USE_HIST )
   {
      len = sizeof(g_history)/sizeof(char *);
      for( c = 0; c < len; c++)
          fputs(g_history[c], stdout);
   }
   else if( level == USE_FIELD_HDR )
   {
      field_s nhdr_fields[NT_HDR_NUM_FIELDS];  /* just do it all here */

      fill_hdr_field_array(nhdr_fields);
      disp_field_s_list("nifti_1_header: ", nhdr_fields, NT_HDR_NUM_FIELDS);
   }
   else if( level == USE_FIELD_ANA )
   {
      field_s nhdr_fields[NT_ANA_NUM_FIELDS];  /* just do it all here */

      fill_ana_field_array(nhdr_fields);
      disp_field_s_list("nifti_analyze75: ",nhdr_fields,NT_ANA_NUM_FIELDS);
   }
   else if( level == USE_FIELD_NIM )
   {
      field_s nim_fields[NT_NIM_NUM_FIELDS];

      fill_nim_field_array(nim_fields);
      disp_field_s_list("nifti_image: ", nim_fields, NT_NIM_NUM_FIELDS);
   }
   else if( level == USE_VERSION )
      fprintf(stdout, "%s, %s\n", prog, g_version);
   else {
      fprintf(stdout,"** illegal level for usage(): %d\n", level);
      return -1;
   }

   return 1;
}